

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct<2,_3>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<2,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long lVar2;
  long lVar3;
  IArg3 local_5a;
  IArg2 local_59;
  IRet *local_58;
  long local_50;
  IRet local_48;
  
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  lVar2 = 0;
  local_58 = __return_storage_ptr__;
  while (lVar2 != 2) {
    local_50 = lVar2;
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      call<deqp::gls::BuiltinPrecisionTests::Functions::Mul>
                (&local_48,ctx,iargs->a->m_data + lVar2,
                 (IArg1 *)(&iargs->b->m_data[0].m_hasNaN + lVar3),&local_59,&local_5a);
      *(double *)((long)&((Interval *)__return_storage_ptr__)->m_hi + lVar3 * 2) = local_48.m_hi;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_3> *)
                &((Interval *)__return_storage_ptr__)->m_hasNaN)->m_data[0].m_data[0].m_hasNaN +
               lVar3 * 2;
      *(undefined8 *)pbVar1 = local_48._0_8_;
      *(double *)(pbVar1 + 8) = local_48.m_lo;
    }
    __return_storage_ptr__ = (IRet *)((long)__return_storage_ptr__ + 0x18);
    lVar2 = local_50 + 1;
  }
  return local_58;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}